

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.h
# Opt level: O1

void __thiscall
spvtools::opt::ConvertToSampledImagePass::ConvertToSampledImagePass
          (ConvertToSampledImagePass *this,
          vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
          *descriptor_set_binding_pairs)

{
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ConvertToSampledImagePass_0094fb88;
  std::
  _Hashtable<spvtools::opt::DescriptorSetAndBinding,spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>,std::__detail::_Identity,std::equal_to<spvtools::opt::DescriptorSetAndBinding>,spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<spvtools::opt::DescriptorSetAndBinding_const*,std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>>
            ((_Hashtable<spvtools::opt::DescriptorSetAndBinding,spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>,std::__detail::_Identity,std::equal_to<spvtools::opt::DescriptorSetAndBinding>,spvtools::opt::ConvertToSampledImagePass::DescriptorSetAndBindingHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->descriptor_set_binding_pairs_,
             (descriptor_set_binding_pairs->
             super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (descriptor_set_binding_pairs->
             super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
             )._M_impl.super__Vector_impl_data._M_finish,0,&local_11,&local_12,&local_13);
  return;
}

Assistant:

explicit ConvertToSampledImagePass(
      const std::vector<DescriptorSetAndBinding>& descriptor_set_binding_pairs)
      : descriptor_set_binding_pairs_(descriptor_set_binding_pairs.begin(),
                                      descriptor_set_binding_pairs.end()) {}